

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve2right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *b,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *rhs)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pnVar1;
  int *piVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  int *piVar6;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  undefined1 auVar7 [56];
  int iVar8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  int *ridx2;
  pointer pnVar9;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  undefined4 in_stack_fffffffffffffdd4;
  undefined8 uVar10;
  undefined8 in_stack_fffffffffffffdf8;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  int *piVar11;
  int *forest;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  int f;
  uint local_178 [2];
  uint auStack_170 [2];
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  uint auStack_150 [2];
  uint local_148 [2];
  undefined8 uStack_140;
  int local_138;
  undefined1 local_134;
  fpclass_type local_130;
  int32_t local_12c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  uint local_d8 [2];
  uint auStack_d0 [2];
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  fpclass_type local_90;
  int32_t local_8c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  (*this->solveTime->_vptr_Timer[3])();
  forest = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  ridx2 = (int *)(ulong)(uint)(rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  piVar11 = (rhs->super_IdxSet).idx;
  this_00 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 0x10;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems[6] = 0;
  epsilon.m_backend.data._M_elems[7] = 0;
  epsilon.m_backend.data._M_elems[8] = 0;
  epsilon.m_backend.data._M_elems[9] = 0;
  epsilon.m_backend.data._M_elems[10] = 0;
  epsilon.m_backend.data._M_elems[0xb] = 0;
  epsilon.m_backend.data._M_elems[0xc] = 0;
  epsilon.m_backend.data._M_elems[0xd] = 0;
  epsilon.m_backend.data._M_elems._56_5_ = 0;
  epsilon.m_backend.data._M_elems[0xf]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&epsilon,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  pnVar1 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar9 = (y->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pnVar9 != pnVar1; pnVar9 = pnVar9 + 1) {
    (pnVar9->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar9->m_backend).prec_elem = 0x10;
    (pnVar9->m_backend).data._M_elems[0] = 0;
    (pnVar9->m_backend).data._M_elems[1] = 0;
    (pnVar9->m_backend).data._M_elems[2] = 0;
    (pnVar9->m_backend).data._M_elems[3] = 0;
    (pnVar9->m_backend).data._M_elems[4] = 0;
    (pnVar9->m_backend).data._M_elems[5] = 0;
    (pnVar9->m_backend).data._M_elems[6] = 0;
    (pnVar9->m_backend).data._M_elems[7] = 0;
    (pnVar9->m_backend).data._M_elems[8] = 0;
    (pnVar9->m_backend).data._M_elems[9] = 0;
    (pnVar9->m_backend).data._M_elems[10] = 0;
    (pnVar9->m_backend).data._M_elems[0xb] = 0;
    (pnVar9->m_backend).data._M_elems[0xc] = 0;
    (pnVar9->m_backend).data._M_elems[0xd] = 0;
    (pnVar9->m_backend).data._M_elems[0xe] = 0;
    (pnVar9->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(pnVar9->m_backend).data._M_elems + 0x3d) = 0;
  }
  this_02 = &this->
             super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  this->usetup = true;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&this->ssvec);
  uVar10 = 0x3dd507;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,b);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    iVar8 = (this->ssvec).super_IdxSet.num;
    local_88.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
    local_88.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
    local_88.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_88.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_88.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_88.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_88.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_88.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_88.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_88.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_88.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_88.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_88.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_88.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_88.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_88.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_88.m_backend.exp = epsilon.m_backend.exp;
    local_88.m_backend.neg = epsilon.m_backend.neg;
    local_88.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_88.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar2 = (x->super_IdxSet).idx;
    pnVar3 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar4 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uStack_a0 = CONCAT35(epsilon.m_backend.data._M_elems[0xf]._1_3_,
                         epsilon.m_backend.data._M_elems._56_5_);
    local_a8[0] = epsilon.m_backend.data._M_elems[0xc];
    local_a8[1] = epsilon.m_backend.data._M_elems[0xd];
    local_b8[0] = epsilon.m_backend.data._M_elems[8];
    local_b8[1] = epsilon.m_backend.data._M_elems[9];
    auStack_b0[0] = epsilon.m_backend.data._M_elems[10];
    auStack_b0[1] = epsilon.m_backend.data._M_elems[0xb];
    local_c8[0] = epsilon.m_backend.data._M_elems[4];
    local_c8[1] = epsilon.m_backend.data._M_elems[5];
    auStack_c0[0] = epsilon.m_backend.data._M_elems[6];
    auStack_c0[1] = epsilon.m_backend.data._M_elems[7];
    local_d8[0] = epsilon.m_backend.data._M_elems[0];
    local_d8[1] = epsilon.m_backend.data._M_elems[1];
    auStack_d0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_d0[1] = epsilon.m_backend.data._M_elems[3];
    local_98 = epsilon.m_backend.exp;
    local_94 = epsilon.m_backend.neg;
    local_90 = epsilon.m_backend.fpclass;
    local_8c = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    auVar7 = ZEXT3256(CONCAT428(in_stack_fffffffffffffdd4,
                                CONCAT424((int)ridx2,
                                          CONCAT816(piVar11,CONCAT88((rhs->
                                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  ).val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,local_d8
                                                  )))));
    eps2_00.m_backend.data._M_elems[0xe] = (int)uVar10;
    eps2_00.m_backend.data._M_elems[0xf] = (int)((ulong)uVar10 >> 0x20);
    eps2_00.m_backend.data._M_elems[0] = auVar7._0_4_;
    eps2_00.m_backend.data._M_elems[1] = auVar7._4_4_;
    eps2_00.m_backend.data._M_elems[2] = auVar7._8_4_;
    eps2_00.m_backend.data._M_elems[3] = auVar7._12_4_;
    eps2_00.m_backend.data._M_elems[4] = auVar7._16_4_;
    eps2_00.m_backend.data._M_elems[5] = auVar7._20_4_;
    eps2_00.m_backend.data._M_elems[6] = auVar7._24_4_;
    eps2_00.m_backend.data._M_elems[7] = auVar7._28_4_;
    eps2_00.m_backend.data._M_elems[8] = auVar7._32_4_;
    eps2_00.m_backend.data._M_elems[9] = auVar7._36_4_;
    eps2_00.m_backend.data._M_elems[10] = auVar7._40_4_;
    eps2_00.m_backend.data._M_elems[0xb] = auVar7._44_4_;
    eps2_00.m_backend.data._M_elems[0xc] = auVar7._48_4_;
    eps2_00.m_backend.data._M_elems[0xd] = auVar7._52_4_;
    eps2_00.m_backend.exp = (int)in_stack_fffffffffffffdf8;
    eps2_00.m_backend.neg = (bool)(char)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    eps2_00.m_backend._69_3_ = (int3)((ulong)in_stack_fffffffffffffdf8 >> 0x28);
    eps2_00.m_backend._72_8_ = b;
    iVar8 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::vSolveRight4update2
                      (this_02,&local_88,pnVar3,piVar2,pnVar4,forest,iVar8,pnVar5,eps2_00,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)this_02,ridx2,(int)piVar11,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)forest,(int *)epsilon.m_backend.data._M_elems._0_8_,
                       (int *)epsilon.m_backend.data._M_elems._8_8_);
    (x->super_IdxSet).num = iVar8;
    x->setupStatus = false;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    uVar10 = 0x3dd520;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    iVar8 = (this->ssvec).super_IdxSet.num;
    local_128.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
    local_128.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
    local_128.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
    local_128.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
    local_128.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
    local_128.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
    local_128.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
    local_128.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
    local_128.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_128.m_backend.exp = epsilon.m_backend.exp;
    local_128.m_backend.neg = epsilon.m_backend.neg;
    local_128.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_128.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar2 = (x->super_IdxSet).idx;
    pnVar3 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar4 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uStack_140 = CONCAT35(epsilon.m_backend.data._M_elems[0xf]._1_3_,
                          epsilon.m_backend.data._M_elems._56_5_);
    local_148[0] = epsilon.m_backend.data._M_elems[0xc];
    local_148[1] = epsilon.m_backend.data._M_elems[0xd];
    local_158[0] = epsilon.m_backend.data._M_elems[8];
    local_158[1] = epsilon.m_backend.data._M_elems[9];
    auStack_150[0] = epsilon.m_backend.data._M_elems[10];
    auStack_150[1] = epsilon.m_backend.data._M_elems[0xb];
    local_168[0] = epsilon.m_backend.data._M_elems[4];
    local_168[1] = epsilon.m_backend.data._M_elems[5];
    auStack_160[0] = epsilon.m_backend.data._M_elems[6];
    auStack_160[1] = epsilon.m_backend.data._M_elems[7];
    local_178[0] = epsilon.m_backend.data._M_elems[0];
    local_178[1] = epsilon.m_backend.data._M_elems[1];
    auStack_170[0] = epsilon.m_backend.data._M_elems[2];
    auStack_170[1] = epsilon.m_backend.data._M_elems[3];
    local_138 = epsilon.m_backend.exp;
    local_134 = epsilon.m_backend.neg;
    local_130 = epsilon.m_backend.fpclass;
    local_12c = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar9 = (rhs->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->forest).super_IdxSet.idx;
    pnVar1 = (this->forest).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    eps2.m_backend.data._M_elems._8_8_ = pnVar9;
    eps2.m_backend.data._M_elems._0_8_ = local_178;
    eps2.m_backend.data._M_elems._16_8_ = piVar11;
    eps2.m_backend.data._M_elems[6] = (int)ridx2;
    eps2.m_backend.data._M_elems[7] = (int)((ulong)ridx2 >> 0x20);
    eps2.m_backend.data._M_elems._32_8_ = pnVar1;
    eps2.m_backend.data._M_elems._40_8_ = &f;
    eps2.m_backend.data._M_elems._48_8_ = piVar6;
    eps2.m_backend.data._M_elems[0xe] = (int)uVar10;
    eps2.m_backend.data._M_elems[0xf] = (int)((ulong)uVar10 >> 0x20);
    eps2.m_backend.exp = (int)in_stack_fffffffffffffdf8;
    eps2.m_backend.neg = (bool)(char)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
    eps2.m_backend._69_3_ = (int3)((ulong)in_stack_fffffffffffffdf8 >> 0x28);
    eps2.m_backend.fpclass = iVar8;
    eps2.m_backend.prec_elem = 0;
    iVar8 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::vSolveRight4update2
                      (this_02,&local_128,pnVar3,piVar2,pnVar4,forest,iVar8,pnVar5,eps2,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)this_02,ridx2,(int)piVar11,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)forest,(int *)epsilon.m_backend.data._M_elems._0_8_,
                       (int *)epsilon.m_backend.data._M_elems._8_8_);
    (x->super_IdxSet).num = iVar8;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve2right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update2(epsilon, x.altValues(), x.altIndexMem(),
                                    ssvec.get_ptr(), sidx, n, y.get_ptr(),
                                    epsilon, rhs.altValues(), ridx, rsize, nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update2(epsilon, x.altValues(), x.altIndexMem(),
                                    ssvec.get_ptr(), sidx, n, y.get_ptr(),
                                    epsilon, rhs.altValues(), ridx, rsize,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}